

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O3

bool __thiscall
udpdiscovery::impl::PeerEnv::Start(PeerEnv *this,PeerParameters *parameters,string *user_data)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  SamePeerMode SVar7;
  ProtocolVersion PVar8;
  ProtocolVersion PVar9;
  bool bVar10;
  bool bVar11;
  undefined2 uVar12;
  uint32_t uVar13;
  int iVar14;
  time_t tVar15;
  long lVar16;
  char *pcVar17;
  int value;
  int reuse_port;
  ulong local_38 [2];
  sockaddr local_28;
  
  PVar8 = parameters->min_supported_protocol_version_;
  PVar9 = parameters->max_supported_protocol_version_;
  uVar13 = parameters->application_id_;
  bVar10 = parameters->can_use_broadcast_;
  bVar11 = parameters->can_use_multicast_;
  uVar12 = *(undefined2 *)&parameters->field_0xe;
  iVar14 = parameters->port_;
  uVar2 = parameters->multicast_group_address_;
  lVar16 = parameters->send_timeout_ms_;
  bVar3 = parameters->can_be_discovered_;
  bVar4 = parameters->can_discover_;
  bVar5 = parameters->discover_self_;
  uVar6 = parameters->field_0x2b;
  SVar7 = parameters->same_peer_mode_;
  (this->parameters_).discovered_peer_ttl_ms_ = parameters->discovered_peer_ttl_ms_;
  (this->parameters_).can_be_discovered_ = bVar3;
  (this->parameters_).can_discover_ = bVar4;
  (this->parameters_).discover_self_ = bVar5;
  (this->parameters_).field_0x2b = uVar6;
  (this->parameters_).same_peer_mode_ = SVar7;
  (this->parameters_).port_ = iVar14;
  (this->parameters_).multicast_group_address_ = uVar2;
  (this->parameters_).send_timeout_ms_ = lVar16;
  (this->parameters_).min_supported_protocol_version_ = PVar8;
  (this->parameters_).max_supported_protocol_version_ = PVar9;
  (this->parameters_).application_id_ = uVar13;
  (this->parameters_).can_use_broadcast_ = bVar10;
  (this->parameters_).can_use_multicast_ = bVar11;
  *(undefined2 *)&(this->parameters_).field_0xe = uVar12;
  std::__cxx11::string::_M_assign((string *)&this->user_data_);
  if (((this->parameters_).can_use_broadcast_ == false) &&
     ((this->parameters_).can_use_multicast_ == false)) {
    pcVar17 = "udpdiscovery::Peer can\'t use broadcast and can\'t use multicast.";
    lVar16 = 0x3f;
  }
  else if (((this->parameters_).can_discover_ == false) &&
          ((this->parameters_).can_be_discovered_ == false)) {
    pcVar17 = "udpdiscovery::Peer can\'t discover and can\'t be discovered.";
    lVar16 = 0x3a;
  }
  else {
    tVar15 = time((time_t *)0x0);
    srand((uint)tVar15);
    uVar13 = rand();
    this->peer_id_ = uVar13;
    iVar14 = socket(2,2,0);
    this->sock_ = iVar14;
    if (iVar14 == -1) {
      pcVar17 = "udpdiscovery::Peer can\'t create socket.";
      lVar16 = 0x27;
    }
    else {
      local_38[0] = CONCAT44(local_38[0]._4_4_,1);
      setsockopt(iVar14,1,6,local_38,4);
      if ((this->parameters_).can_discover_ != true) {
        return true;
      }
      iVar14 = socket(2,2,0);
      this->binding_sock_ = iVar14;
      if (iVar14 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"udpdiscovery::Peer can\'t create binding socket.",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
        close(this->sock_);
        this->sock_ = -1;
        iVar14 = this->binding_sock_;
      }
      local_38[0] = CONCAT44(local_38[0]._4_4_,1);
      setsockopt(iVar14,1,2,local_38,4);
      local_28.sa_family = 1;
      local_28.sa_data[0] = '\0';
      local_28.sa_data[1] = '\0';
      setsockopt(this->binding_sock_,1,0xf,&local_28,4);
      if ((this->parameters_).can_use_multicast_ == true) {
        uVar2 = (this->parameters_).multicast_group_address_;
        local_38[0] = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
        setsockopt(this->binding_sock_,0,0x23,local_38,8);
      }
      local_28.sa_data[6] = '\0';
      local_28.sa_data[7] = '\0';
      local_28.sa_data[8] = '\0';
      local_28.sa_data[9] = '\0';
      local_28.sa_data[10] = '\0';
      local_28.sa_data[0xb] = '\0';
      local_28.sa_data[0xc] = '\0';
      local_28.sa_data[0xd] = '\0';
      uVar1 = (ushort)(this->parameters_).port_;
      local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
      local_28.sa_family = 2;
      local_28.sa_data[2] = '\0';
      local_28.sa_data[3] = '\0';
      local_28.sa_data[4] = '\0';
      local_28.sa_data[5] = '\0';
      iVar14 = bind(this->binding_sock_,&local_28,0x10);
      if (-1 < iVar14) {
        local_38[0] = 1;
        local_38[1] = 0;
        setsockopt(this->binding_sock_,1,0x14,local_38,0x10);
        return true;
      }
      close(this->binding_sock_);
      this->binding_sock_ = -1;
      close(this->sock_);
      this->sock_ = -1;
      pcVar17 = "udpdiscovery::Peer can\'t bind socket.";
      lVar16 = 0x25;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,lVar16);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return false;
}

Assistant:

bool Start(const PeerParameters& parameters, const std::string& user_data) {
    parameters_ = parameters;
    user_data_ = user_data;

    if (!parameters_.can_use_broadcast() && !parameters_.can_use_multicast()) {
      std::cerr
          << "udpdiscovery::Peer can't use broadcast and can't use multicast."
          << std::endl;
      return false;
    }

    if (!parameters_.can_discover() && !parameters_.can_be_discovered()) {
      std::cerr << "udpdiscovery::Peer can't discover and can't be discovered."
                << std::endl;
      return false;
    }

    InitSockets();

    peer_id_ = MakeRandomId();

    sock_ = socket(AF_INET, SOCK_DGRAM, 0);
    if (sock_ == kInvalidSocket) {
      std::cerr << "udpdiscovery::Peer can't create socket." << std::endl;
      return false;
    }

    {
      int value = 1;
      setsockopt(sock_, SOL_SOCKET, SO_BROADCAST, (const char*)&value,
                 sizeof(value));
    }

    if (parameters_.can_discover()) {
      binding_sock_ = socket(AF_INET, SOCK_DGRAM, 0);
      if (binding_sock_ == kInvalidSocket) {
        std::cerr << "udpdiscovery::Peer can't create binding socket."
                  << std::endl;

        CloseSocket(sock_);
        sock_ = kInvalidSocket;
      }

      {
        int reuse_addr = 1;
        setsockopt(binding_sock_, SOL_SOCKET, SO_REUSEADDR,
                   (const char*)&reuse_addr, sizeof(reuse_addr));
#ifdef SO_REUSEPORT
        int reuse_port = 1;
        setsockopt(binding_sock_, SOL_SOCKET, SO_REUSEPORT,
                   (const char*)&reuse_port, sizeof(reuse_port));
#endif
      }

      if (parameters_.can_use_multicast()) {
        struct ip_mreq mreq;
        mreq.imr_multiaddr.s_addr =
            htonl(parameters_.multicast_group_address());
        mreq.imr_interface.s_addr = INADDR_ANY;
        setsockopt(binding_sock_, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                   (const char*)&mreq, sizeof(mreq));
      }

      sockaddr_in addr;
      memset((char*)&addr, 0, sizeof(sockaddr_in));
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(INADDR_ANY);

      if (bind(binding_sock_, (struct sockaddr*)&addr, sizeof(sockaddr_in)) <
          0) {
        CloseSocket(binding_sock_);
        binding_sock_ = kInvalidSocket;

        CloseSocket(sock_);
        sock_ = kInvalidSocket;

        std::cerr << "udpdiscovery::Peer can't bind socket." << std::endl;
        return false;
      }

      // TODO: Implement the way to unblock recvfrom without timeouting.
      SetSocketTimeout(binding_sock_, SO_RCVTIMEO, 1000);
    }

    return true;
  }